

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O1

bool __thiscall
USBSignalFilter::SkipNoise
          (USBSignalFilter *this,AnalyzerChannelData *pNearer,AnalyzerChannelData *pFurther)

{
  char cVar1;
  
  cVar1 = '\0';
  if ((this->mSampleDur <= 20.0) && (this->mSpeed != FULL_SPEED)) {
    cVar1 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)pNearer);
    if (cVar1 != '\0') {
      AnalyzerChannelData::AdvanceToNextEdge();
      AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pFurther);
    }
  }
  return (bool)cVar1;
}

Assistant:

bool USBSignalFilter::SkipNoise( AnalyzerChannelData* pNearer, AnalyzerChannelData* pFurther )
{
    if( mSampleDur > 20 // sample rate < 50Mhz?
        || mSpeed == FULL_SPEED )
        return false;

    // up to 20ns
    const U32 IGNORE_PULSE_SAMPLES = mSampleDur == 10 ? 2 : 1;

    // skip the glitch
    if( pNearer->WouldAdvancingCauseTransition( IGNORE_PULSE_SAMPLES ) )
    {
        pNearer->AdvanceToNextEdge();
        pFurther->AdvanceToAbsPosition( pNearer->GetSampleNumber() );

        return true;
    }

    return false;
}